

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhinull.cpp
# Opt level: O1

void __thiscall
QNullTextureRenderTarget::QNullTextureRenderTarget
          (QNullTextureRenderTarget *this,QRhiImplementation *rhi,
          QRhiTextureRenderTargetDescription *desc,Flags flags)

{
  QRhiTextureRenderTarget::QRhiTextureRenderTarget
            (&this->super_QRhiTextureRenderTarget,rhi,desc,flags);
  (this->super_QRhiTextureRenderTarget).super_QRhiRenderTarget.super_QRhiResource._vptr_QRhiResource
       = (_func_int **)&PTR__QNullTextureRenderTarget_007eca60;
  (this->d).rp = (QNullRenderPassDescriptor *)0x0;
  (this->d).pixelSize.wd = -1;
  (this->d).pixelSize.ht = -1;
  (this->d).dpr = 1.0;
  (this->d).currentResIdList.super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>.
  super_QVLABaseBase.a = 0x11;
  (this->d).currentResIdList.super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>.
  super_QVLABaseBase.s = 0;
  (this->d).currentResIdList.super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>.
  super_QVLABaseBase.ptr = &(this->d).currentResIdList.super_QVLAStorage<16UL,_8UL,_17LL>;
  return;
}

Assistant:

QNullTextureRenderTarget::QNullTextureRenderTarget(QRhiImplementation *rhi,
                                                   const QRhiTextureRenderTargetDescription &desc,
                                                   Flags flags)
    : QRhiTextureRenderTarget(rhi, desc, flags),
      d(rhi)
{
}